

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.h
# Opt level: O2

void GEO::CmdLine::declare_arg(string *name,int default_value,string *description,ArgFlags flags)

{
  int default_value_local;
  string local_40;
  
  default_value_local = default_value;
  String::to_string<int>(&local_40,&default_value_local);
  declare_arg(name,ARG_INT,&local_40,description,flags);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

inline void declare_arg(
            const std::string& name,
            int default_value,
            const std::string& description,
            ArgFlags flags = ARG_FLAGS_DEFAULT
        ) {
            declare_arg(
                name, ARG_INT, String::to_string(default_value),
                description, flags
            );
        }